

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall
google::LogMessage::Init
          (LogMessage *this,char *file,int line,LogSeverity severity,SendMethod send_method)

{
  _func_int *p_Var1;
  long lVar2;
  WallTime WVar3;
  undefined1 uVar4;
  code cVar5;
  int iVar6;
  LogMessageData *pLVar7;
  int *piVar8;
  char *pcVar9;
  ostream *poVar10;
  long *this_00;
  undefined8 in_R9;
  LogStream *pLVar11;
  long *in_FS_OFFSET;
  string stacktrace;
  MutexLock l;
  string local_d8;
  MutexLock local_b8 [17];
  
  this->allocated_ = (LogMessageData *)0x0;
  if ((severity == 3) && (exit_on_dfatal != '\0')) {
    local_b8[0].mu_ = (Mutex *)fatal_msg_lock;
    if (fatal_msg_lock[0x38] == '\x01') {
      iVar6 = pthread_rwlock_wrlock((pthread_rwlock_t *)fatal_msg_lock);
      if (iVar6 != 0) {
        abort();
      }
    }
    if (fatal_msg_exclusive == '\0') {
      fatal_msg_exclusive = '\x01';
      this->data_ = (LogMessageData *)fatal_msg_data_exclusive;
      fatal_msg_data_exclusive[0x7721] = 1;
    }
    else {
      this->data_ = (LogMessageData *)&fatal_msg_data_shared;
      DAT_00140909 = 0;
    }
    ::glog_internal_namespace_::MutexLock::~MutexLock(local_b8);
  }
  else {
    lVar2 = *in_FS_OFFSET;
    if (*(char *)(lVar2 + -0x7730) == '\x01') {
      *(undefined1 *)(lVar2 + -0x7730) = 0;
      pLVar7 = (LogMessageData *)(lVar2 + -0x7728);
      LogMessageData::LogMessageData(pLVar7);
    }
    else {
      pLVar7 = (LogMessageData *)operator_new(0x7728);
      LogMessageData::LogMessageData(pLVar7);
      this->allocated_ = pLVar7;
    }
    this->data_ = pLVar7;
    pLVar7->first_fatal_ = false;
  }
  pcVar9 = this->data_->message_text_ +
           (long)((this->data_->stream_).super_ostream._vptr_basic_ostream[-3] + -4);
  if (pcVar9[0x7619] == '\0') {
    uVar4 = std::ios::widen((char)pcVar9 + '8');
    pcVar9[0x7618] = uVar4;
    pcVar9[0x7619] = 1;
  }
  pcVar9[0x7618] = 0x30;
  piVar8 = __errno_location();
  pLVar7 = this->data_;
  pLVar7->preserved_errno_ = *piVar8;
  pLVar7->severity_ = (char)severity;
  pLVar7->line_ = line;
  pLVar7->send_method_ = send_method;
  *(undefined8 *)&pLVar7->field_0x76a8 = in_R9;
  (pLVar7->field_6).sink_ = (LogSink *)0x0;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  WVar3 = glog_internal_namespace_::WallTime_Now();
  pLVar7 = this->data_;
  pLVar7->timestamp_ = (long)WVar3;
  localtime_r(&pLVar7->timestamp_,(tm *)&pLVar7->tm_time_);
  pLVar7 = this->data_;
  lVar2 = pLVar7->timestamp_;
  pLVar7->num_chars_to_log_ = 0;
  pLVar7->num_chars_to_syslog_ = 0;
  pcVar9 = glog_internal_namespace_::const_basename(file);
  pLVar7 = this->data_;
  pLVar7->basename_ = pcVar9;
  pLVar7->fullname_ = file;
  pLVar7->has_been_flushed_ = false;
  if ((line != -1) && (fLB::FLAGS_log_prefix != '\0')) {
    local_b8[0].mu_._0_1_ = **(undefined1 **)(LogSeverityNames + (long)severity * 8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (&(pLVar7->stream_).super_ostream,(char *)local_b8,1);
    *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
    this_00 = (long *)std::ostream::operator<<(poVar10,(this->data_->tm_time_).tm_mon + 1);
    *(undefined8 *)((long)this_00 + *(long *)(*this_00 + -0x18) + 0x10) = 2;
    poVar10 = (ostream *)std::ostream::operator<<(this_00,(this->data_->tm_time_).tm_mday);
    local_b8[0].mu_._0_1_ = 0x20;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_b8,1);
    *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(this->data_->tm_time_).tm_hour);
    local_b8[0].mu_._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_b8,1);
    *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(this->data_->tm_time_).tm_min);
    local_b8[0].mu_._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_b8,1);
    *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(this->data_->tm_time_).tm_sec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
    *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 6;
    poVar10 = (ostream *)
              std::ostream::operator<<(poVar10,(int)((WVar3 - (double)lVar2) * 1000000.0));
    local_b8[0].mu_._0_1_ = 0x20;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_b8,1);
    p_Var1 = (_func_int *)
             ((long)&poVar10->_vptr_basic_ostream + (long)poVar10->_vptr_basic_ostream[-3]);
    if ((&poVar10->field_0xe1)[(long)poVar10->_vptr_basic_ostream[-3]] == '\0') {
      cVar5 = (code)std::ios::widen((char)p_Var1);
      p_Var1[0xe0] = cVar5;
      p_Var1[0xe1] = (code)0x1;
    }
    p_Var1[0xe0] = (code)0x20;
    *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 5;
    glog_internal_namespace_::GetTID();
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    p_Var1 = (_func_int *)
             ((long)&poVar10->_vptr_basic_ostream + (long)poVar10->_vptr_basic_ostream[-3]);
    if ((&poVar10->field_0xe1)[(long)poVar10->_vptr_basic_ostream[-3]] == '\0') {
      cVar5 = (code)std::ios::widen((char)p_Var1);
      p_Var1[0xe0] = cVar5;
      p_Var1[0xe1] = (code)0x1;
    }
    p_Var1[0xe0] = (code)0x30;
    local_b8[0].mu_._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_b8,1);
  }
  pLVar7 = this->data_;
  pLVar7->num_prefix_chars_ =
       *(long *)&(pLVar7->stream_).super_ostream.field_0x30 -
       *(long *)&(pLVar7->stream_).super_ostream.field_0x28;
  if (fLS::FLAGS_log_backtrace_at_abi_cxx11_[1] != 0) {
    snprintf((char *)local_b8,0x80,"%s:%d",pLVar7->basename_,(ulong)(uint)line);
    iVar6 = strcmp((char *)*fLS::FLAGS_log_backtrace_at_abi_cxx11_,(char *)local_b8);
    if (iVar6 == 0) {
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      glog_internal_namespace_::DumpStackTraceToString(&local_d8);
      pLVar11 = &this->data_->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar11->super_ostream," (stacktrace:\n",0xe);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (&pLVar11->super_ostream,local_d8._M_dataplus._M_p,
                           local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return;
}

Assistant:

void LogMessage::Init(const char* file,
                      int line,
                      LogSeverity severity,
                      void (LogMessage::*send_method)()) {
  allocated_ = NULL;
  if (severity != GLOG_FATAL || !exit_on_dfatal) {
#ifdef GLOG_THREAD_LOCAL_STORAGE
    // No need for locking, because this is thread local.
    if (thread_data_available) {
      thread_data_available = false;
#ifdef HAVE_ALIGNED_STORAGE
      data_ = new (&thread_msg_data) LogMessageData;
#else
      const uintptr_t kAlign = sizeof(void*) - 1;

      char* align_ptr =
          reinterpret_cast<char*>(reinterpret_cast<uintptr_t>(thread_msg_data + kAlign) & ~kAlign);
      data_ = new (align_ptr) LogMessageData;
      assert(reinterpret_cast<uintptr_t>(align_ptr) % sizeof(void*) == 0);
#endif
    } else {
      allocated_ = new LogMessageData();
      data_ = allocated_;
    }
#else // !defined(GLOG_THREAD_LOCAL_STORAGE)
    allocated_ = new LogMessageData();
    data_ = allocated_;
#endif // defined(GLOG_THREAD_LOCAL_STORAGE)
    data_->first_fatal_ = false;
  } else {
    MutexLock l(&fatal_msg_lock);
    if (fatal_msg_exclusive) {
      fatal_msg_exclusive = false;
      data_ = &fatal_msg_data_exclusive;
      data_->first_fatal_ = true;
    } else {
      data_ = &fatal_msg_data_shared;
      data_->first_fatal_ = false;
    }
  }

  stream().fill('0');
  data_->preserved_errno_ = errno;
  data_->severity_ = severity;
  data_->line_ = line;
  data_->send_method_ = send_method;
  data_->sink_ = NULL;
  data_->outvec_ = NULL;
  WallTime now = WallTime_Now();
  data_->timestamp_ = static_cast<time_t>(now);
  localtime_r(&data_->timestamp_, &data_->tm_time_);
  int usecs = static_cast<int>((now - data_->timestamp_) * 1000000);

  data_->num_chars_to_log_ = 0;
  data_->num_chars_to_syslog_ = 0;
  data_->basename_ = const_basename(file);
  data_->fullname_ = file;
  data_->has_been_flushed_ = false;

  // If specified, prepend a prefix to each line.  For example:
  //    I1018 160715 f5d4fbb0 logging.cc:1153]
  //    (log level, GMT month, date, time, thread_id, file basename, line)
  // We exclude the thread_id for the default thread.
  if (FLAGS_log_prefix && (line != kNoLogPrefix)) {
    stream() << LogSeverityNames[severity][0]
             << setw(2) << 1+data_->tm_time_.tm_mon
             << setw(2) << data_->tm_time_.tm_mday
             << ' '
             << setw(2) << data_->tm_time_.tm_hour  << ':'
             << setw(2) << data_->tm_time_.tm_min   << ':'
             << setw(2) << data_->tm_time_.tm_sec   << "."
             << setw(6) << usecs
             << ' '
             << setfill(' ') << setw(5)
             << static_cast<unsigned int>(GetTID()) << setfill('0')
             << ' ';
             // @huihut delete file & line
            //  << data_->basename_ << ':' << data_->line_ << "] ";
  }
  data_->num_prefix_chars_ = data_->stream_.pcount();

  if (!FLAGS_log_backtrace_at.empty()) {
    char fileline[128];
    snprintf(fileline, sizeof(fileline), "%s:%d", data_->basename_, line);
#ifdef HAVE_STACKTRACE
    if (!strcmp(FLAGS_log_backtrace_at.c_str(), fileline)) {
      string stacktrace;
      DumpStackTraceToString(&stacktrace);
      stream() << " (stacktrace:\n" << stacktrace << ") ";
    }
#endif
  }
}